

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

size_t __thiscall
Memory::check_memory_internal
          (Memory *this,PatternAddressMapper *mapping,char *start,char *end,
          bool reproducibility_mode,bool verbose)

{
  char *__s1;
  byte *flipped_address;
  byte actual_value;
  byte expected_value;
  int iVar1;
  int iVar2;
  void *__ptr;
  byte *pbVar3;
  unsigned_long timestamp;
  size_t sVar4;
  ulong __size;
  ulong uVar5;
  int *piVar6;
  size_t j;
  ulong uVar7;
  long lVar8;
  pointer pvVar9;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar10;
  Memory *pMVar11;
  undefined1 local_120 [8];
  int expected_rand_value;
  ulong local_108;
  int *local_100;
  vector<BitFlip,_std::allocator<BitFlip>_> *local_f8;
  uint64_t local_f0;
  ulong local_e8;
  undefined1 local_e0 [8];
  DRAMAddr flipped_addr_dram;
  string local_c0;
  size_t local_a0;
  PatternAddressMapper *local_98;
  ulong local_90;
  Memory *local_88;
  char *local_80;
  undefined1 local_78 [8];
  BitFlip bitflip;
  allocator<char> local_31;
  
  bitflip.observation_time._0_4_ = (undefined4)CONCAT71(in_register_00000089,verbose);
  bitflip.observation_time._4_4_ = (undefined4)CONCAT71(in_register_00000081,reproducibility_mode);
  local_98 = mapping;
  if (start == (char *)0x0 || end <= start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"Function check_memory called with invalid arguments.",
               (allocator<char> *)&local_c0);
    Logger::log_error((string *)local_78,true);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Start addr.: %s",&local_31);
    DRAMAddr::DRAMAddr((DRAMAddr *)local_120,start);
    DRAMAddr::to_string_abi_cxx11_((string *)local_e0,(DRAMAddr *)local_120);
    format_string<char_const*>((string *)local_78,&local_c0,(char *)local_e0);
    Logger::log_data((string *)local_78,true);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"End addr.: %s",&local_31);
    DRAMAddr::DRAMAddr((DRAMAddr *)local_120,end);
    DRAMAddr::to_string_abi_cxx11_((string *)local_e0,(DRAMAddr *)local_120);
    format_string<char_const*>((string *)local_78,&local_c0,(char *)local_e0);
    Logger::log_data((string *)local_78,true);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    local_a0 = 0;
  }
  else {
    uVar10 = (long)start - (long)this->start_address;
    iVar1 = getpagesize();
    __size = (ulong)iVar1;
    uVar10 = uVar10 - uVar10 % __size;
    local_80 = end + (uVar10 - (long)start);
    uVar5 = (ulong)local_80 % __size;
    __ptr = calloc(1,__size);
    if (__ptr == (void *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,"Could not create temporary page for memory comparison.",
                 (allocator<char> *)&local_c0);
      Logger::log_error((string *)local_78,true);
      std::__cxx11::string::~string((string *)local_78);
      exit(1);
    }
    local_80 = (char *)((long)local_80 - uVar5);
    local_e8 = __size >> 2;
    local_f8 = &this->flipped_bits;
    local_a0 = 0;
    local_88 = this;
    for (; uVar10 < local_80; uVar10 = uVar10 + __size) {
      local_90 = uVar10;
      srand(iVar1 * (int)uVar10);
      uVar5 = local_e8;
      for (uVar7 = 0; pMVar11 = local_88, uVar10 = local_90, uVar5 != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = rand();
        *(int *)((long)__ptr + uVar7 * 4) = iVar2;
      }
      __s1 = local_88->start_address + local_90;
      if (__s1 + __size < local_88->start_address + local_88->size) {
        iVar2 = bcmp(__s1,__ptr,__size);
        if (iVar2 != 0) goto LAB_0013b633;
      }
      else {
LAB_0013b633:
        for (uVar5 = 0; uVar5 < __size; uVar5 = uVar5 + 4) {
          piVar6 = (int *)(pMVar11->start_address + uVar10 + uVar5);
          if (piVar6 < pMVar11->start_address + pMVar11->size) {
            clflushopt((char)*piVar6);
            iVar2 = *(int *)((long)__ptr + uVar5);
            local_120._0_4_ = iVar2;
            if (*piVar6 != iVar2) {
              local_108 = uVar5;
              local_100 = piVar6;
              for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                actual_value = local_120[lVar8];
                if (*(byte *)((long)piVar6 + lVar8) != actual_value) {
                  flipped_address = (byte *)((long)piVar6 + lVar8);
                  DRAMAddr::DRAMAddr((DRAMAddr *)local_e0,flipped_address);
                  pbVar3 = (byte *)DRAMAddr::to_virt((DRAMAddr *)local_e0);
                  if (flipped_address != pbVar3) {
                    __assert_fail("flipped_address == (volatile char*)flipped_addr_dram.to_virt()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/src/Memory/Memory.cpp"
                                  ,0xa7,
                                  "size_t Memory::check_memory_internal(PatternAddressMapper &, const volatile char *, const volatile char *, bool, bool)"
                                 );
                  }
                  expected_value = *flipped_address;
                  if ((char)bitflip.observation_time != '\0') {
                    local_f0 = flipped_addr_dram.bank;
                    timestamp = time((time_t *)0x0);
                    Logger::log_bitflip((char *)flipped_address,local_f0,actual_value,expected_value
                                        ,timestamp,true);
                  }
                  BitFlip::BitFlip((BitFlip *)local_78,(DRAMAddr *)local_e0,
                                   actual_value ^ expected_value,expected_value);
                  if (bitflip.observation_time._4_1_ == '\0') {
                    pvVar9 = (local_98->bit_flips).
                             super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    if ((local_98->bit_flips).
                        super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == pvVar9) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_c0,
                                 "Cannot store bit flips found in given address mapping.\nYou need to create an empty vector in PatternAddressMapper::bit_flips before calling check_memory."
                                 ,&local_31);
                      Logger::log_error(&local_c0,true);
                      std::__cxx11::string::~string((string *)&local_c0);
                      pvVar9 = (local_98->bit_flips).
                               super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    std::vector<BitFlip,_std::allocator<BitFlip>_>::push_back
                              (pvVar9 + -1,(BitFlip *)local_78);
                  }
                  std::vector<BitFlip,_std::allocator<BitFlip>_>::push_back
                            (local_f8,(BitFlip *)local_78);
                  sVar4 = BitFlip::count_bit_corruptions((BitFlip *)local_78);
                  local_a0 = local_a0 + sVar4;
                  uVar5 = local_108;
                  piVar6 = local_100;
                }
              }
              *piVar6 = iVar2;
              clflushopt((char)*piVar6);
              uVar10 = local_90;
              pMVar11 = local_88;
            }
          }
        }
      }
    }
    free(__ptr);
  }
  return local_a0;
}

Assistant:

size_t Memory::check_memory_internal(PatternAddressMapper &mapping,
                                     const volatile char *start,
                                     const volatile char *end,
                                     bool reproducibility_mode,
                                     bool verbose) {
  // counter for the number of found bit flips in the memory region [start, end]
  size_t found_bitflips = 0;

  if (start==nullptr || end==nullptr || ((uint64_t) start >= (uint64_t) end)) {
    Logger::log_error("Function check_memory called with invalid arguments.");
    Logger::log_data(format_string("Start addr.: %s", DRAMAddr((void *) start).to_string().c_str()));
    Logger::log_data(format_string("End addr.: %s", DRAMAddr((void *) end).to_string().c_str()));
    return found_bitflips;
  }

  auto start_offset = (uint64_t) (start - start_address);

  const auto pagesize = static_cast<size_t>(getpagesize());
  start_offset = (start_offset/pagesize)*pagesize;

  auto end_offset = start_offset + (uint64_t) (end - start);
  end_offset = (end_offset/pagesize)*pagesize;

  void *page_raw = malloc(pagesize);
  if (page_raw == nullptr) {
    Logger::log_error("Could not create temporary page for memory comparison.");
    exit(EXIT_FAILURE);
  }
  memset(page_raw, 0, pagesize);
  int *page = (int*)page_raw;

  // for each page (4K) in the address space [start, end]
  for (uint64_t i = start_offset; i < end_offset; i += pagesize) {
    // reseed rand to have the desired sequence of reproducible numbers
    srand(static_cast<unsigned int>(i*pagesize));

    // fill comparison page with expected values generated by rand()
    for (size_t j = 0; j < (unsigned long) pagesize/sizeof(int); ++j)
      page[j] = rand();

    uint64_t addr = ((uint64_t)start_address+i);

    // check if any bit flipped in the page using the fast memcmp function, if any flip occurred we need to iterate over
    // each byte one-by-one (much slower), otherwise we just continue with the next page
    if ((addr+ pagesize) < ((uint64_t)start_address+size) && memcmp((void*)addr, (void*)page, pagesize) == 0)
      continue;

    // iterate over blocks of 4 bytes (=sizeof(int))
    for (uint64_t j = 0; j < (uint64_t) pagesize; j += sizeof(int)) {
      uint64_t offset = i + j;
      volatile char *cur_addr = start_address + offset;

      // if this address is outside the superpage we must not proceed to avoid segfault
      if ((uint64_t)cur_addr >= ((uint64_t)start_address+size))
        continue;

      // clear the cache to make sure we do not access a cached value
      clflushopt(cur_addr);
      mfence();

      // if the bit did not flip -> continue checking next block
      int expected_rand_value = page[j/sizeof(int)];
      if (*((int *) cur_addr)==expected_rand_value)
        continue;

      // if the bit flipped -> compare byte per byte
      for (unsigned long c = 0; c < sizeof(int); c++) {
        volatile char *flipped_address = cur_addr + c;
        if (*flipped_address != ((char *) &expected_rand_value)[c]) {
          const auto flipped_addr_dram = DRAMAddr((void *) flipped_address);
          assert(flipped_address == (volatile char*)flipped_addr_dram.to_virt());
          const auto flipped_addr_value = *(unsigned char *) flipped_address;
          const auto expected_value = ((unsigned char *) &expected_rand_value)[c];
          if (verbose) {
            Logger::log_bitflip(flipped_address, flipped_addr_dram.row,
                expected_value, flipped_addr_value, (size_t) time(nullptr), true);
          }
          // store detailed information about the bit flip
          BitFlip bitflip(flipped_addr_dram, (expected_value ^ flipped_addr_value), flipped_addr_value);
          // ..in the mapping that triggered this bit flip
          if (!reproducibility_mode) {
            if (mapping.bit_flips.empty()) {
              Logger::log_error("Cannot store bit flips found in given address mapping.\n"
                                "You need to create an empty vector in PatternAddressMapper::bit_flips before calling "
                                "check_memory.");
            }
            mapping.bit_flips.back().push_back(bitflip);
          }
          // ..in an attribute of this class so that it can be retrived by the caller
          flipped_bits.push_back(bitflip);
          found_bitflips += bitflip.count_bit_corruptions();
        }
      }

      // restore original (unflipped) value
      *((int *) cur_addr) = expected_rand_value;

      // flush this address so that value is committed before hammering again there
      clflushopt(cur_addr);
      mfence();
    }
  }
  
  free(page);
  return found_bitflips;
}